

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O3

void Msat_IntVecPushUniqueOrder(Msat_IntVec_t *p,int Entry,int fIncrease)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  ulong uVar5;
  
  Msat_IntVecPushUnique(p,Entry);
  if (1 < (long)p->nSize) {
    piVar3 = p->pArray;
    uVar5 = (long)p->nSize + 1;
    do {
      iVar1 = piVar3[uVar5 - 3];
      iVar2 = piVar3[uVar5 - 2];
      bVar4 = iVar1 <= iVar2;
      if (fIncrease == 0) {
        bVar4 = iVar2 <= iVar1;
      }
      if (bVar4) {
        return;
      }
      piVar3[uVar5 - 2] = iVar1;
      piVar3[uVar5 - 3] = iVar2;
      uVar5 = uVar5 - 1;
    } while (2 < uVar5);
  }
  return;
}

Assistant:

void Msat_IntVecPushUniqueOrder( Msat_IntVec_t * p, int Entry, int fIncrease )
{
    int Entry1, Entry2;
    int i;
    Msat_IntVecPushUnique( p, Entry );
    // find the p of the node
    for ( i = p->nSize-1; i > 0; i-- )
    {
        Entry1 = p->pArray[i  ];
        Entry2 = p->pArray[i-1];
        if (( fIncrease && Entry1 >= Entry2) ||
            (!fIncrease && Entry1 <= Entry2) )
            break;
        p->pArray[i  ] = Entry2;
        p->pArray[i-1] = Entry1;
    }
}